

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O3

int cmime_string_is_8bit(char *s)

{
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,0x73,"int cmime_string_is_8bit(const char *)");
  }
  if ('\0' < *s) {
    do {
    } while( true );
  }
  return -(uint)(*s == '\0');
}

Assistant:

int cmime_string_is_8bit(const char *s) {
    const char *it = NULL;

    assert(s);
    it = s;
    while(*it != '\0') {
        if ((unsigned char)(*it) > (unsigned char) 127)
            return(0);
    }
        
    return(-1);
}